

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O0

Orphan<capnp::compiler::Expression> *
capnp::_::PointerHelpers<capnp::compiler::Expression,_(capnp::Kind)3>::disown
          (PointerBuilder builder)

{
  Orphan<capnp::compiler::Expression> *in_RDI;
  OrphanBuilder local_30;
  
  PointerBuilder::disown(&local_30,(PointerBuilder *)&stack0x00000008);
  Orphan<capnp::compiler::Expression>::Orphan(in_RDI,&local_30);
  OrphanBuilder::~OrphanBuilder(&local_30);
  return in_RDI;
}

Assistant:

static inline Orphan<T> disown(PointerBuilder builder) {
    return Orphan<T>(builder.disown());
  }